

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86.cpp
# Opt level: O2

int __thiscall ncnn::TanH_x86::forward_inplace(TanH_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  int iVar3;
  float *pfVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  Mat local_78;
  
  iVar6 = bottom_top_blob->c;
  iVar8 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 4) {
    iVar5 = 0;
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    for (; iVar5 != iVar6; iVar5 = iVar5 + 1) {
      Mat::channel(&local_78,bottom_top_blob,iVar5);
      pfVar4 = (float *)local_78.data;
      Mat::~Mat(&local_78);
      auVar13 = _DAT_002da450;
      auVar14 = _DAT_002da440;
      iVar3 = iVar8;
      while (bVar9 = iVar3 != 0, iVar3 = iVar3 + -1, bVar9) {
        auVar10._0_4_ = *pfVar4 * -2.0;
        auVar10._4_4_ = pfVar4[1] * -2.0;
        auVar10._8_4_ = pfVar4[2] * -2.0;
        auVar10._12_4_ = pfVar4[3] * -2.0;
        auVar11 = minps(auVar10,auVar14);
        auVar11 = maxps(auVar11,auVar13);
        fVar19 = auVar11._0_4_ * 1.442695 + 0.5;
        fVar21 = auVar11._4_4_ * 1.442695 + 0.5;
        fVar23 = auVar11._8_4_ * 1.442695 + 0.5;
        fVar24 = auVar11._12_4_ * 1.442695 + 0.5;
        fVar15 = (float)(int)fVar19;
        fVar16 = (float)(int)fVar21;
        fVar17 = (float)(int)fVar23;
        fVar18 = (float)(int)fVar24;
        fVar15 = fVar15 - (float)(-(uint)(fVar19 < fVar15) & 0x3f800000);
        fVar16 = fVar16 - (float)(-(uint)(fVar21 < fVar16) & 0x3f800000);
        fVar17 = fVar17 - (float)(-(uint)(fVar23 < fVar17) & 0x3f800000);
        fVar18 = fVar18 - (float)(-(uint)(fVar24 < fVar18) & 0x3f800000);
        fVar19 = fVar15 * -0.6931472 + auVar11._0_4_;
        fVar21 = fVar16 * -0.6931472 + auVar11._4_4_;
        fVar23 = fVar17 * -0.6931472 + auVar11._8_4_;
        fVar24 = fVar18 * -0.6931472 + auVar11._12_4_;
        auVar12._0_4_ = fVar19 * fVar19;
        auVar12._4_4_ = fVar21 * fVar21;
        auVar12._8_4_ = fVar23 * fVar23;
        auVar12._12_4_ = fVar24 * fVar24;
        fVar20 = (float)((int)fVar15 * 0x800000 + 0x3f800000) *
                 (fVar19 + 1.0 +
                 (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
                   0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5) * auVar12._0_4_) + 1.0;
        fVar22 = (float)((int)fVar16 * 0x800000 + 0x3f800000) *
                 (fVar21 + 1.0 +
                 (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
                   0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5) * auVar12._4_4_) + 1.0;
        fVar17 = (float)((int)fVar17 * 0x800000 + 0x3f800000) *
                 (fVar23 + 1.0 +
                 (((((fVar23 * 0.00019875691 + 0.0013981999) * fVar23 + 0.008333452) * fVar23 +
                   0.041665796) * fVar23 + 0.16666666) * fVar23 + 0.5) * auVar12._8_4_) + 1.0;
        fVar23 = (float)((int)fVar18 * 0x800000 + 0x3f800000) *
                 (fVar24 + 1.0 +
                 (((((fVar24 * 0.00019875691 + 0.0013981999) * fVar24 + 0.008333452) * fVar24 +
                   0.041665796) * fVar24 + 0.16666666) * fVar24 + 0.5) * auVar12._12_4_) + 1.0;
        auVar1._4_4_ = fVar22;
        auVar1._0_4_ = fVar20;
        auVar1._8_4_ = fVar17;
        auVar1._12_4_ = fVar23;
        auVar11 = rcpps(auVar12,auVar1);
        fVar15 = auVar11._0_4_;
        fVar19 = auVar11._4_4_;
        fVar16 = auVar11._8_4_;
        fVar21 = auVar11._12_4_;
        *pfVar4 = (2.0 - fVar20 * (fVar15 + fVar15)) * fVar15 + fVar15 + fVar15 + -1.0;
        pfVar4[1] = (2.0 - fVar22 * (fVar19 + fVar19)) * fVar19 + fVar19 + fVar19 + -1.0;
        pfVar4[2] = (2.0 - fVar17 * (fVar16 + fVar16)) * fVar16 + fVar16 + fVar16 + -1.0;
        pfVar4[3] = (2.0 - fVar23 * (fVar21 + fVar21)) * fVar21 + fVar21 + fVar21 + -1.0;
        pfVar4 = pfVar4 + 4;
      }
    }
  }
  else {
    iVar5 = 0;
    if (iVar6 < 1) {
      iVar6 = 0;
      iVar5 = 0;
    }
    for (; iVar5 != iVar6; iVar5 = iVar5 + 1) {
      Mat::channel(&local_78,bottom_top_blob,iVar5);
      pvVar2 = local_78.data;
      Mat::~Mat(&local_78);
      lVar7 = 0;
      pfVar4 = (float *)pvVar2;
      for (iVar3 = 0; iVar3 + 3 < iVar8; iVar3 = iVar3 + 4) {
        auVar13._0_4_ = *pfVar4 * -2.0;
        auVar13._4_4_ = pfVar4[1] * -2.0;
        auVar13._8_4_ = pfVar4[2] * -2.0;
        auVar13._12_4_ = pfVar4[3] * -2.0;
        auVar14 = minps(auVar13,_DAT_002da440);
        auVar14 = maxps(auVar14,_DAT_002da450);
        fVar19 = auVar14._0_4_ * 1.442695 + 0.5;
        fVar21 = auVar14._4_4_ * 1.442695 + 0.5;
        fVar23 = auVar14._8_4_ * 1.442695 + 0.5;
        fVar24 = auVar14._12_4_ * 1.442695 + 0.5;
        fVar15 = (float)(int)fVar19;
        fVar16 = (float)(int)fVar21;
        fVar17 = (float)(int)fVar23;
        fVar18 = (float)(int)fVar24;
        fVar15 = fVar15 - (float)(-(uint)(fVar19 < fVar15) & 0x3f800000);
        fVar16 = fVar16 - (float)(-(uint)(fVar21 < fVar16) & 0x3f800000);
        fVar17 = fVar17 - (float)(-(uint)(fVar23 < fVar17) & 0x3f800000);
        fVar18 = fVar18 - (float)(-(uint)(fVar24 < fVar18) & 0x3f800000);
        fVar19 = fVar15 * -0.6931472 + auVar14._0_4_;
        fVar21 = fVar16 * -0.6931472 + auVar14._4_4_;
        fVar23 = fVar17 * -0.6931472 + auVar14._8_4_;
        fVar24 = fVar18 * -0.6931472 + auVar14._12_4_;
        auVar11._0_4_ = fVar19 * fVar19;
        auVar11._4_4_ = fVar21 * fVar21;
        auVar11._8_4_ = fVar23 * fVar23;
        auVar11._12_4_ = fVar24 * fVar24;
        fVar20 = (float)((int)fVar15 * 0x800000 + 0x3f800000) *
                 (fVar19 + 1.0 +
                 (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
                   0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5) * auVar11._0_4_) + 1.0;
        fVar22 = (float)((int)fVar16 * 0x800000 + 0x3f800000) *
                 (fVar21 + 1.0 +
                 (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
                   0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5) * auVar11._4_4_) + 1.0;
        fVar17 = (float)((int)fVar17 * 0x800000 + 0x3f800000) *
                 (fVar23 + 1.0 +
                 (((((fVar23 * 0.00019875691 + 0.0013981999) * fVar23 + 0.008333452) * fVar23 +
                   0.041665796) * fVar23 + 0.16666666) * fVar23 + 0.5) * auVar11._8_4_) + 1.0;
        fVar23 = (float)((int)fVar18 * 0x800000 + 0x3f800000) *
                 (fVar24 + 1.0 +
                 (((((fVar24 * 0.00019875691 + 0.0013981999) * fVar24 + 0.008333452) * fVar24 +
                   0.041665796) * fVar24 + 0.16666666) * fVar24 + 0.5) * auVar11._12_4_) + 1.0;
        auVar14._4_4_ = fVar22;
        auVar14._0_4_ = fVar20;
        auVar14._8_4_ = fVar17;
        auVar14._12_4_ = fVar23;
        auVar14 = rcpps(auVar11,auVar14);
        fVar15 = auVar14._0_4_;
        fVar19 = auVar14._4_4_;
        fVar16 = auVar14._8_4_;
        fVar21 = auVar14._12_4_;
        *pfVar4 = (2.0 - fVar20 * (fVar15 + fVar15)) * fVar15 + fVar15 + fVar15 + -1.0;
        pfVar4[1] = (2.0 - fVar22 * (fVar19 + fVar19)) * fVar19 + fVar19 + fVar19 + -1.0;
        pfVar4[2] = (2.0 - fVar17 * (fVar16 + fVar16)) * fVar16 + fVar16 + fVar16 + -1.0;
        pfVar4[3] = (2.0 - fVar23 * (fVar21 + fVar21)) * fVar21 + fVar21 + fVar21 + -1.0;
        pfVar4 = pfVar4 + 4;
        lVar7 = lVar7 + 4;
      }
      for (; (int)lVar7 < iVar8; lVar7 = lVar7 + 1) {
        fVar15 = tanhf(*(float *)((long)pvVar2 + lVar7 * 4));
        *(float *)((long)pvVar2 + lVar7 * 4) = fVar15;
      }
    }
  }
  return 0;
}

Assistant:

int TanH_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = tanh_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = tanh_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanh(*ptr);
            ptr++;
        }
    }

    return 0;
}